

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

void __thiscall libchars::command_node::clear(command_node *this)

{
  command_node *pcVar1;
  
  pcVar1 = this->head;
  if (pcVar1 != (command_node *)0x0) {
    ~command_node(pcVar1);
  }
  operator_delete(pcVar1,0x58);
  pcVar1 = this->start;
  if (pcVar1 != (command_node *)0x0) {
    ~command_node(pcVar1);
  }
  operator_delete(pcVar1,0x58);
  pcVar1 = this->next;
  if (pcVar1 != (command_node *)0x0) {
    ~command_node(pcVar1);
  }
  operator_delete(pcVar1,0x58);
  this->mask = 0;
  this->hidden = false;
  this->cmd = (command *)0x0;
  this->head = (command_node *)0x0;
  this->tail = (command_node *)0x0;
  this->next = (command_node *)0x0;
  this->start = (command_node *)0x0;
  return;
}

Assistant:

void command_node::clear()
    {
        delete head;
        delete start;
        delete next;

        mask = 0;
        hidden = false;
        cmd = NULL;
        head = NULL;
        tail = NULL;
        next = NULL;
        start = NULL;
    }